

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests_doNothingOnLeftButtonUpEventWhenHandIsEmpty_Test::
~EventsProcessorTests_doNothingOnLeftButtonUpEventWhenHandIsEmpty_Test
          (EventsProcessorTests_doNothingOnLeftButtonUpEventWhenHandIsEmpty_Test *this)

{
  EventsProcessorTests_doNothingOnLeftButtonUpEventWhenHandIsEmpty_Test *this_local;
  
  ~EventsProcessorTests_doNothingOnLeftButtonUpEventWhenHandIsEmpty_Test(this);
  operator_delete(this,0xf20);
  return;
}

Assistant:

TEST_F(EventsProcessorTests, doNothingOnLeftButtonUpEventWhenHandIsEmpty) {
    expectEvent(MouseLeftButtonUp {});
    EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
    EXPECT_CALL(solitaireMock, getCardsInHand()).WillOnce(ReturnRef(noCards));
    EXPECT_CALL(contextMock, getCardsInHandPosition()).WillOnce(Return(cardsInHandPosition));
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}